

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void jpeg_make_c_derived_tbl(j_compress_ptr cinfo,boolean isDC,int tblno,c_derived_tbl **pdtbl)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long *in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  uint code;
  uint huffcode [257];
  char huffsize [257];
  int maxsymbol;
  int si;
  int lastp;
  int l;
  int i;
  int p;
  c_derived_tbl *dtbl;
  JHUFF_TBL *htbl;
  long local_568;
  uint local_55c;
  uint auStack_558 [260];
  char local_148 [264];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  uint local_30;
  int local_2c;
  long local_28;
  long local_20;
  long *local_18;
  int local_10;
  int local_c;
  long *local_8;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if ((in_EDX < 0) || (3 < in_EDX)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x34;
    *(int *)(*in_RDI + 0x2c) = in_EDX;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (local_c == 0) {
    local_568 = local_8[(long)local_10 + 0x18];
  }
  else {
    local_568 = local_8[(long)local_10 + 0x14];
  }
  local_20 = local_568;
  if (local_568 == 0) {
    *(undefined4 *)(*local_8 + 0x28) = 0x34;
    *(int *)(*local_8 + 0x2c) = local_10;
    (**(code **)*local_8)(local_8);
  }
  if (*local_18 == 0) {
    lVar3 = (**(code **)local_8[1])(local_8,1,0x500);
    *local_18 = lVar3;
  }
  local_28 = *local_18;
  local_2c = 0;
  for (local_34 = 1; local_34 < 0x11; local_34 = local_34 + 1) {
    local_30 = (uint)*(byte *)(local_20 + local_34);
    if (0x100 < (int)(local_2c + local_30)) {
      *(undefined4 *)(*local_8 + 0x28) = 9;
      (**(code **)*local_8)(local_8);
    }
    while (uVar1 = local_30, local_30 = local_30 - 1, uVar1 != 0) {
      lVar3 = (long)local_2c;
      local_2c = local_2c + 1;
      local_148[lVar3] = (char)local_34;
    }
  }
  local_148[local_2c] = '\0';
  local_38 = local_2c;
  local_55c = 0;
  local_3c = (int)local_148[0];
  local_2c = 0;
  while (local_148[local_2c] != '\0') {
    while (iVar2 = local_2c, local_148[local_2c] == local_3c) {
      local_2c = local_2c + 1;
      auStack_558[iVar2] = local_55c;
      local_55c = local_55c + 1;
    }
    if (1L << ((byte)local_3c & 0x3f) <= (long)(ulong)local_55c) {
      *(undefined4 *)(*local_8 + 0x28) = 9;
      (**(code **)*local_8)(local_8);
    }
    local_55c = local_55c << 1;
    local_3c = local_3c + 1;
  }
  memset((void *)(local_28 + 0x400),0,0x100);
  local_40 = 0xff;
  if (local_c != 0) {
    local_40 = 0xf;
  }
  for (local_2c = 0; local_2c < local_38; local_2c = local_2c + 1) {
    local_30 = (uint)*(byte *)(local_20 + 0x11 + (long)local_2c);
    if ((local_40 < (int)local_30) || (*(char *)(local_28 + 0x400 + (long)(int)local_30) != '\0')) {
      *(undefined4 *)(*local_8 + 0x28) = 9;
      (**(code **)*local_8)(local_8);
    }
    *(uint *)(local_28 + (long)(int)local_30 * 4) = auStack_558[local_2c];
    *(char *)(local_28 + 0x400 + (long)(int)local_30) = local_148[local_2c];
  }
  return;
}

Assistant:

LOCAL(void)
jpeg_make_c_derived_tbl (j_compress_ptr cinfo, boolean isDC, int tblno,
			 c_derived_tbl ** pdtbl)
{
  JHUFF_TBL *htbl;
  c_derived_tbl *dtbl;
  int p, i, l, lastp, si, maxsymbol;
  char huffsize[257];
  unsigned int huffcode[257];
  unsigned int code;

  /* Note that huffsize[] and huffcode[] are filled in code-length order,
   * paralleling the order of the symbols themselves in htbl->huffval[].
   */

  /* Find the input Huffman table */
  if (tblno < 0 || tblno >= NUM_HUFF_TBLS)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);
  htbl =
    isDC ? cinfo->dc_huff_tbl_ptrs[tblno] : cinfo->ac_huff_tbl_ptrs[tblno];
  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);

  /* Allocate a workspace if we haven't already done so. */
  if (*pdtbl == NULL)
    *pdtbl = (c_derived_tbl *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(c_derived_tbl));
  dtbl = *pdtbl;
  
  /* Figure C.1: make table of Huffman code length for each symbol */

  p = 0;
  for (l = 1; l <= 16; l++) {
    i = (int) htbl->bits[l];
    if (i < 0 || p + i > 256)	/* protect against table overrun */
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    while (i--)
      huffsize[p++] = (char) l;
  }
  huffsize[p] = 0;
  lastp = p;
  
  /* Figure C.2: generate the codes themselves */
  /* We also validate that the counts represent a legal Huffman code tree. */

  code = 0;
  si = huffsize[0];
  p = 0;
  while (huffsize[p]) {
    while (((int) huffsize[p]) == si) {
      huffcode[p++] = code;
      code++;
    }
    /* code is now 1 more than the last code used for codelength si; but
     * it must still fit in si bits, since no code is allowed to be all ones.
     */
    if (((INT32) code) >= (((INT32) 1) << si))
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    code <<= 1;
    si++;
  }
  
  /* Figure C.3: generate encoding tables */
  /* These are code and size indexed by symbol value */

  /* Set all codeless symbols to have code length 0;
   * this lets us detect duplicate VAL entries here, and later
   * allows emit_bits to detect any attempt to emit such symbols.
   */
  MEMZERO(dtbl->ehufsi, SIZEOF(dtbl->ehufsi));

  /* This is also a convenient place to check for out-of-range
   * and duplicated VAL entries.  We allow 0..255 for AC symbols
   * but only 0..15 for DC.  (We could constrain them further
   * based on data depth and mode, but this seems enough.)
   */
  maxsymbol = isDC ? 15 : 255;

  for (p = 0; p < lastp; p++) {
    i = htbl->huffval[p];
    if (i < 0 || i > maxsymbol || dtbl->ehufsi[i])
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    dtbl->ehufco[i] = huffcode[p];
    dtbl->ehufsi[i] = huffsize[p];
  }
}